

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Task *pTVar1;
  bool bVar2;
  Type (*paTVar3) [6000];
  Workitem *this;
  Task *itask;
  undefined8 *puVar4;
  ostream *poVar5;
  Type *pTVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  Type *pTVar10;
  long lVar11;
  int i;
  float fVar12;
  double dVar13;
  double dVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  Type (*local_40) [6000];
  Type *local_38;
  
  lVar11 = 0;
  printf("Using %d chunks\n",4);
  uVar15 = 0;
  uVar16 = 1;
  uVar17 = 2;
  uVar18 = 3;
  do {
    *(float *)((long)v + lVar11) =
         ((float)(uVar15 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar15 & 0xffff | 0x4b000000);
    *(float *)((long)v + lVar11 + 4) =
         ((float)(uVar16 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar16 & 0xffff | 0x4b000000);
    *(float *)((long)v + lVar11 + 8) =
         ((float)(uVar17 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar17 & 0xffff | 0x4b000000);
    *(float *)((long)v + lVar11 + 0xc) =
         ((float)(uVar18 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar18 & 0xffff | 0x4b000000);
    uVar15 = uVar15 + 4;
    uVar16 = uVar16 + 4;
    uVar17 = uVar17 + 4;
    uVar18 = uVar18 + 4;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 24000);
  paTVar3 = mx;
  lVar11 = 0;
  do {
    result[lVar11] = 0.0;
    auVar19._8_4_ = (int)lVar11;
    auVar19._0_8_ = lVar11;
    auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar7 = 0;
    lVar20 = 0;
    lVar21 = 1;
    lVar22 = 2;
    lVar23 = 3;
    do {
      uVar17 = (uint)(lVar22 + lVar11);
      uVar18 = (uint)(lVar23 + auVar19._8_8_);
      uVar15 = (uint)(lVar20 + lVar11);
      uVar16 = (uint)(lVar21 + auVar19._8_8_);
      pTVar10 = *paTVar3 + lVar7;
      *pTVar10 = ((float)(uVar15 >> 0x10 | 0x53000000) - 5.497642e+11) +
                 (float)(uVar15 & 0xffff | 0x4b000000);
      pTVar10[1] = ((float)(uVar16 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(uVar16 & 0xffff | 0x4b000000);
      pTVar10[2] = ((float)(uVar17 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(uVar17 & 0xffff | 0x4b000000);
      pTVar10[3] = ((float)(uVar18 >> 0x10 | 0x53000000) - 5.497642e+11) +
                   (float)(uVar18 & 0xffff | 0x4b000000);
      lVar7 = lVar7 + 4;
      lVar20 = lVar20 + 4;
      lVar21 = lVar21 + 4;
      lVar22 = lVar22 + 4;
      lVar23 = lVar23 + 4;
    } while (lVar7 != 6000);
    lVar11 = lVar11 + 1;
    paTVar3 = paTVar3 + 1;
  } while (lVar11 != 6000);
  paTVar3 = mx;
  lVar20 = 0;
  pTVar10 = result;
  lVar11 = std::chrono::_V2::system_clock::now();
  do {
    fVar12 = 0.0;
    lVar21 = 0;
    do {
      fVar12 = fVar12 + *(float *)((long)*paTVar3 + lVar21) * *(float *)((long)v + lVar21);
      lVar21 = lVar21 + 4;
    } while (lVar21 != 24000);
    result[lVar20] = fVar12;
    lVar20 = lVar20 + 1;
    paTVar3 = paTVar3 + 1;
  } while (lVar20 != 0x5dc);
  uVar8 = 0xfffffffffffffa24;
  paTVar3 = mx;
  lVar20 = std::chrono::_V2::system_clock::now();
  pTVar6 = result;
  do {
    local_40 = paTVar3;
    local_38 = pTVar6;
    depspawn::
    spawn<void_(float_*,_const_float_(*)[6000],_const_float_*),_float_*,_const_float_(*)[6000],_float_(&)[6000]>
              (mxv,&local_38,(float (**) [6000])&local_40,&v);
    if ((depspawn::internal::TP == (Task *)0x0) ||
       (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
      depspawn::internal::start_master();
    }
    this = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
    depspawn::internal::Workitem::Workitem(this,(arg_info *)0x0,0);
    pTVar1 = depspawn::internal::TP;
    itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                       &depspawn::internal::TP[9].next);
    *(undefined8 *)&(itask->func_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
    (itask->func_).super__Function_base._M_manager = (_Manager_type)0x0;
    (itask->func_)._M_invoker = (_Invoker_type)0x0;
    puVar4 = (undefined8 *)operator_new(0x10);
    *puVar4 = pica;
    puVar4[1] = pTVar10;
    *(undefined8 **)&(itask->func_).super__Function_base._M_functor = puVar4;
    (itask->func_)._M_invoker =
         std::_Function_handler<void_(),_std::_Bind<void_(*(float_*))(float_*)>_>::_M_invoke;
    (itask->func_).super__Function_base._M_manager =
         std::_Function_handler<void_(),_std::_Bind<void_(*(float_*))(float_*)>_>::_M_manager;
    itask->ctx_ = this;
    itask->next = pTVar1;
    depspawn::internal::Workitem::insert_in_worklist(this,itask);
    uVar8 = uVar8 + 0x5dc;
    paTVar3 = paTVar3 + 0x5dc;
    pTVar10 = pTVar10 + 0x5dc;
    pTVar6 = pTVar6 + 0x5dc;
  } while (uVar8 < 0x1194);
  depspawn::wait_for_all();
  lVar21 = std::chrono::_V2::system_clock::now();
  dVar13 = (double)(lVar20 - lVar11) / 1000000000.0;
  dVar14 = (double)(lVar21 - lVar20) / 1000000000.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Serial time: ",0xd);
  poVar5 = std::ostream::_M_insert<double>(dVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s.  Parallel time: ",0x13);
  poVar5 = std::ostream::_M_insert<double>(dVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s.\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Speedup (using ",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," chunks): ",10);
  poVar5 = std::ostream::_M_insert<double>(dVar13 / dVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar2 = test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TEST ",5);
  pcVar9 = "UNSUCCESSFUL";
  if (bVar2) {
    pcVar9 = "SUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar9,(ulong)!bVar2 * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return (int)!bVar2;
}

Assistant:

int main(int argc, char **argv)
{ int i, j;
  
  assert(!(M % CHUNKS));
  
  printf("Using %d chunks\n", CHUNKS);

  for (i = 0; i < N; i++) {
    v[i] = i;
  }
  
  for (i = 0; i < M; i++) {
    result[i] = 0;
    for( j = 0; j < N; j++)
      mx[i][j] = i + j;
  }
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t0 = std::chrono::high_resolution_clock::now();
  
  mxv(result, mx, v);
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t1 = std::chrono::high_resolution_clock::now();
  
  //matrix - vector product using CHUNKS chunks
  for(i = 0; i < M; i+= BCK) {
    //mxv(result + i, (const Type (*)[N]) &(mx[i][0]), v);
    spawn(mxv, result + i, (const Type (*)[N]) &(mx[i][0]), v);
    //pica(result + i);
    spawn(pica, result + i);
  }
 
  wait_for_all();
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t2 = std::chrono::high_resolution_clock::now();
  
  double serial_time = std::chrono::duration<double>(t1-t0).count();
  double parallel_time = std::chrono::duration<double>(t2-t1).count();
  
  std::cout << "Serial time: " << serial_time << "s.  Parallel time: " << parallel_time << "s.\n";
  std::cout << "Speedup (using " << CHUNKS << " chunks): " <<  (serial_time / parallel_time) << std::endl;
  
  const bool test_ok = test();
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}